

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsStamp.cpp
# Opt level: O3

void __thiscall OpenMD::ZConsStamp::~ZConsStamp(ZConsStamp *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__ZConsStamp_002feb90;
  (this->CantVel).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fb320;
  pcVar2 = (this->CantVel).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->CantVel).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->Kratio).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fb320;
  pcVar2 = (this->Kratio).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->Kratio).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->Zpos).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__ParameterBase_002fb320;
  pcVar2 = (this->Zpos).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->Zpos).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->MolIndex).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_002fb320;
  pcVar2 = (this->MolIndex).super_ParameterBase.keyword_._M_dataplus._M_p;
  paVar1 = &(this->MolIndex).super_ParameterBase.keyword_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__DataHolder_002fb408;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->super_DataHolder).deprecatedKeywords_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::~_Rb_tree(&(this->super_DataHolder).parameters_._M_t);
  return;
}

Assistant:

ZConsStamp::~ZConsStamp() {}